

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Div::innerExtrema
          (Interval *__return_storage_ptr__,Div *this,EvalContext *param_1,Interval *nom,
          Interval *den)

{
  double dVar1;
  double dVar2;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  if ((den->m_lo <= 0.0) && (0.0 <= den->m_hi)) {
    dVar1 = nom->m_lo;
    if ((dVar1 <= 0.0) && (0.0 <= nom->m_hi)) {
      __return_storage_ptr__->m_hasNaN = true;
      __return_storage_ptr__->m_lo = INFINITY;
      __return_storage_ptr__->m_hi = -INFINITY;
    }
    if ((dVar1 < 0.0) || (0.0 < nom->m_hi)) {
      dVar1 = __return_storage_ptr__->m_lo;
      dVar2 = __return_storage_ptr__->m_hi;
      if (-INFINITY <= dVar1) {
        dVar1 = -INFINITY;
      }
      if (dVar2 <= INFINITY) {
        dVar2 = INFINITY;
      }
      __return_storage_ptr__->m_lo = dVar1;
      __return_storage_ptr__->m_hi = dVar2;
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	innerExtrema	(const EvalContext&,
								 const Interval&		nom,
								 const Interval&		den) const
	{
		Interval ret;

		if (den.contains(0.0))
		{
			if (nom.contains(0.0))
				ret |= TCU_NAN;

			if (nom.lo() < 0.0 || nom.hi() > 0.0)
				ret |= Interval::unbounded();
		}

		return ret;
	}